

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O3

message_order * __thiscall
FIX::DataDictionary::getMessageOrderedFields(DataDictionary *this,string *msgType)

{
  const_iterator cVar1;
  message_order *pmVar2;
  ConfigError *this_00;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FIX::DataDictionary::MessageFieldsOrderHolder>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FIX::DataDictionary::MessageFieldsOrderHolder>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FIX::DataDictionary::MessageFieldsOrderHolder>_>_>
          ::find(&(this->m_messageOrderedFields)._M_t,msgType);
  if ((_Rb_tree_header *)cVar1._M_node !=
      &(this->m_messageOrderedFields)._M_t._M_impl.super__Rb_tree_header) {
    pmVar2 = MessageFieldsOrderHolder::getMessageOrder
                       ((MessageFieldsOrderHolder *)(cVar1._M_node + 2));
    return pmVar2;
  }
  this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::operator+(&local_60,"<Message> ",msgType);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
  local_40._M_dataplus._M_p = (pointer)*plVar3;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_40._M_dataplus._M_p == psVar4) {
    local_40.field_2._M_allocated_capacity = *psVar4;
    local_40.field_2._8_8_ = plVar3[3];
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  }
  else {
    local_40.field_2._M_allocated_capacity = *psVar4;
  }
  local_40._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  ConfigError::ConfigError(this_00,&local_40);
  __cxa_throw(this_00,&ConfigError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(ConfigError) {
  MsgTypeToOrderedFields::const_iterator iter = m_messageOrderedFields.find(msgType);
  if (iter == m_messageOrderedFields.end()) {
    throw ConfigError("<Message> " + msgType + " does not have a stored message order");
  }

  return iter->second.getMessageOrder();
}